

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O3

EdgeType raviX_get_edge_type(Graph *g,nodeId_t from,nodeId_t to)

{
  GraphNode *pGVar1;
  GraphNodeLink *pGVar2;
  EdgeType EVar3;
  ulong uVar4;
  
  EVar3 = EDGE_TYPE_UNCLASSIFIED;
  if (((from < g->allocated) && (pGVar1 = g->nodes[from], pGVar1 != (GraphNode *)0x0)) &&
     ((ulong)*(ushort *)&pGVar1->succs != 0)) {
    pGVar2 = (pGVar1->succs).links;
    uVar4 = 0;
    while (pGVar2[uVar4].node_index != to) {
      uVar4 = uVar4 + 1;
      if (*(ushort *)&pGVar1->succs == uVar4) {
        return EDGE_TYPE_UNCLASSIFIED;
      }
    }
    EVar3 = (EdgeType)pGVar2[uVar4].edge_type;
  }
  return EVar3;
}

Assistant:

enum EdgeType raviX_get_edge_type(Graph *g, nodeId_t from, nodeId_t to)
{
	GraphNode *prednode = raviX_get_node(g, from);
	if (prednode == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	struct GraphNodeLink *node_link = node_list_get(&prednode->succs, to);
	if (node_link == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	return (enum EdgeType) node_link->edge_type;
}